

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QXcbConnection::TabletData>::moveAppend
          (QGenericArrayOps<QXcbConnection::TabletData> *this,TabletData *b,TabletData *e)

{
  qsizetype *pqVar1;
  undefined8 *puVar2;
  TabletData *pTVar3;
  long lVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  Data *pDVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  TabletData *pTVar12;
  DeviceType DVar13;
  
  if ((b != e) && (b < e)) {
    pTVar3 = (this->super_QArrayDataPointer<QXcbConnection::TabletData>).ptr;
    do {
      lVar4 = (this->super_QArrayDataPointer<QXcbConnection::TabletData>).size;
      pTVar3[lVar4].deviceId = b->deviceId;
      pDVar5 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pTVar3[lVar4].name.d.d = pDVar5;
      pcVar6 = (b->name).d.ptr;
      (b->name).d.ptr = (char16_t *)0x0;
      pTVar3[lVar4].name.d.ptr = pcVar6;
      qVar7 = (b->name).d.size;
      (b->name).d.size = 0;
      pTVar3[lVar4].name.d.size = qVar7;
      DVar13 = b->tool;
      uVar9 = *(undefined8 *)&b->buttons;
      uVar10 = *(undefined8 *)
                ((long)&(b->buttons).super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                        super_QFlagsStorage<Qt::MouseButton>.i + 1);
      uVar11 = *(undefined8 *)((long)&b->serialId + 1);
      pTVar12 = pTVar3 + lVar4;
      pTVar12->pointerType = b->pointerType;
      pTVar12->tool = DVar13;
      *(undefined8 *)(&pTVar12->pointerType + 2) = uVar9;
      puVar2 = (undefined8 *)
               ((long)&pTVar3[lVar4].buttons.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                       super_QFlagsStorage<Qt::MouseButton>.i + 1);
      *puVar2 = uVar10;
      puVar2[1] = uVar11;
      pDVar8 = (b->valuatorInfo).d;
      (b->valuatorInfo).d = (Data *)0x0;
      pTVar3[lVar4].valuatorInfo.d = pDVar8;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QXcbConnection::TabletData>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }